

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::whenMoreResolved
          (DeferredThirdPartyClient *this)

{
  ClientHook *pCVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  DeferredThirdPartyClient *in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar2;
  
  pCVar1 = ensureAccepted(in_RSI);
  (*pCVar1->_vptr_ClientHook[3])(this,pCVar1);
  MVar2.ptr.field_1 = extraout_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
      // Someone (locally) is waiting for this capability to resolve. We had better actually
      // accept it.
      //
      // Note that this will *always* return non-null, because accepting a capability always
      // ends up returning a promise cap of some sort. (Even when introduced-to-self, we need to
      // wait for the `Provite` message to show up.)
      return ensureAccepted().whenMoreResolved();
    }